

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O0

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
anon_unknown.dwarf_1d5768::CAPIBuildEngineDelegate::lookupRule
          (CAPIBuildEngineDelegate *this,KeyType *key)

{
  CAPIRule *this_00;
  KeyType *in_RDX;
  size_t local_38;
  llb_data_t key_data;
  CAPIRule *capiRule;
  KeyType *key_local;
  CAPIBuildEngineDelegate *this_local;
  
  this_00 = (CAPIRule *)operator_new(0x68);
  CAPIRule::CAPIRule(this_00,in_RDX);
  this_00->engineContext = (void *)(key->key).field_2._M_allocated_capacity;
  key_data.data = (uint8_t *)this_00;
  local_38 = llbuild::core::KeyType::size(in_RDX);
  key_data.length = (uint64_t)llbuild::core::KeyType::data(in_RDX);
  (**(code **)&key[1].key)((key->key).field_2._M_allocated_capacity,&local_38,key_data.data + 0x30);
  if (*(long *)(key_data.data + 0x48) == 0) {
    __assert_fail("capiRule->rule.create_task && \"client failed to initialize rule\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                  ,0x4d,
                  "virtual std::unique_ptr<Rule> (anonymous namespace)::CAPIBuildEngineDelegate::lookupRule(const KeyType &)"
                 );
  }
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
             (pointer)key_data.data);
  return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
         )(__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
           )this;
}

Assistant:

virtual std::unique_ptr<Rule> lookupRule(const KeyType& key) override {
    CAPIRule* capiRule = new CAPIRule(key);
    capiRule->engineContext = cAPIDelegate.context;
    llb_data_t key_data{ key.size(), (const uint8_t*)key.data() };
    cAPIDelegate.lookup_rule(cAPIDelegate.context, &key_data, &capiRule->rule);

    // FIXME: Check that the client created the rule appropriately. We should
    // change the API to be type safe here, by forcing the client to return a
    // handle created by the C API.
    assert(capiRule->rule.create_task && "client failed to initialize rule");

    return std::unique_ptr<Rule>(capiRule);
  }